

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse2_128_8.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_scan_profile_sse2_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  uint uVar16;
  void *pvVar17;
  parasail_matrix_t *ppVar18;
  int *piVar19;
  undefined1 auVar20 [16];
  char cVar21;
  byte bVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  parasail_result_t *ppVar26;
  __m128i *ptr;
  int8_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar27;
  int iVar28;
  __m128i *palVar29;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  int8_t iVar35;
  int iVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  ushort uVar40;
  long lVar41;
  uint uVar42;
  ulong size;
  undefined4 uVar44;
  undefined1 uVar48;
  undefined1 uVar50;
  undefined1 uVar52;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  ulong uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  __m128i alVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  __m128i_8_t e;
  __m128i_8_t h;
  long local_160;
  int local_158;
  char local_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  char cVar43;
  char cVar49;
  char cVar51;
  char cVar53;
  ushort uVar71;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_scan_profile_sse2_128_8_cold_8();
  }
  else {
    pvVar17 = (profile->profile8).score;
    if (pvVar17 == (void *)0x0) {
      parasail_sg_flags_table_scan_profile_sse2_128_8_cold_7();
    }
    else {
      ppVar18 = profile->matrix;
      if (ppVar18 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_scan_profile_sse2_128_8_cold_6();
      }
      else {
        uVar16 = profile->s1Len;
        if ((int)uVar16 < 1) {
          parasail_sg_flags_table_scan_profile_sse2_128_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_scan_profile_sse2_128_8_cold_4();
        }
        else {
          uVar33 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_table_scan_profile_sse2_128_8_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_table_scan_profile_sse2_128_8_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_table_scan_profile_sse2_128_8_cold_1();
          }
          else {
            iVar23 = uVar16 - 1;
            uVar62 = (ulong)uVar16 + 0xf;
            size = uVar62 >> 4;
            uVar42 = (uint)size;
            iVar24 = iVar23 / (int)uVar42;
            iVar34 = -open;
            iVar25 = ppVar18->min;
            uVar30 = (uint)(byte)-(char)iVar25;
            if (iVar25 != iVar34 && SBORROW4(iVar25,iVar34) == iVar25 + open < 0) {
              uVar30 = open;
            }
            cVar21 = '~' - (char)ppVar18->max;
            ppVar26 = parasail_result_new_table1((uint)uVar62 & 0x7ffffff0,s2Len);
            if (ppVar26 != (parasail_result_t *)0x0) {
              ppVar26->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar26->flag | 0x10120402;
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign_int8_t(0x10,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              if (ptr_03 != (__m128i *)0x0 &&
                  ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                  (ptr_00 != (int8_t *)0x0 && ptr != (__m128i *)0x0))) {
                iVar25 = s2Len + -1;
                iVar27 = 0xf - iVar24;
                uVar52 = (undefined1)((uint)open >> 0x18);
                uVar50 = (undefined1)((uint)open >> 0x10);
                uVar48 = (undefined1)((uint)open >> 8);
                auVar45._4_4_ =
                     (int)(CONCAT35(CONCAT21(CONCAT11(uVar52,uVar52),uVar50),CONCAT14(uVar50,open))
                          >> 0x20);
                auVar45[3] = uVar48;
                auVar45[2] = uVar48;
                auVar45[0] = (undefined1)open;
                auVar45[1] = auVar45[0];
                auVar45._8_8_ = 0;
                auVar45 = pshuflw(auVar45,auVar45,0);
                uVar44 = auVar45._0_4_;
                auVar61._4_4_ = uVar44;
                auVar61._0_4_ = uVar44;
                auVar61._8_4_ = uVar44;
                auVar61._12_4_ = uVar44;
                uVar52 = (undefined1)((uint)gap >> 0x18);
                uVar50 = (undefined1)((uint)gap >> 0x10);
                uVar48 = (undefined1)((uint)gap >> 8);
                auVar58._4_4_ =
                     (int)(CONCAT35(CONCAT21(CONCAT11(uVar52,uVar52),uVar50),CONCAT14(uVar50,gap))
                          >> 0x20);
                auVar58[3] = uVar48;
                auVar58[2] = uVar48;
                auVar58[0] = (char)gap;
                auVar58[1] = auVar58[0];
                auVar58._8_8_ = 0;
                auVar45 = pshuflw(auVar58,auVar58,0);
                uVar44 = auVar45._0_4_;
                bVar22 = (char)uVar30 + 0x81;
                uVar40 = (ushort)bVar22;
                auVar45 = pshuflw(ZEXT216(CONCAT11(bVar22,bVar22)),ZEXT216(CONCAT11(bVar22,bVar22)),
                                  0);
                auVar46._0_4_ = auVar45._0_4_;
                auVar46._4_4_ = auVar46._0_4_;
                auVar46._8_4_ = auVar46._0_4_;
                auVar46._12_4_ = auVar46._0_4_;
                auVar54 = ZEXT216(CONCAT11(cVar21,cVar21));
                auVar54 = pshuflw(auVar54,auVar54,0);
                auVar59._0_4_ = auVar54._0_4_;
                auVar59._4_4_ = auVar59._0_4_;
                auVar59._8_4_ = auVar59._0_4_;
                auVar59._12_4_ = auVar59._0_4_;
                uVar52 = (undefined1)((uint)iVar27 >> 0x18);
                uVar50 = (undefined1)((uint)iVar27 >> 0x10);
                uVar48 = (undefined1)((uint)iVar27 >> 8);
                auVar57._4_4_ =
                     (int)(CONCAT35(CONCAT21(CONCAT11(uVar52,uVar52),uVar50),CONCAT14(uVar50,iVar27)
                                   ) >> 0x20);
                auVar57[3] = uVar48;
                auVar57[2] = uVar48;
                auVar57[0] = (undefined1)iVar27;
                auVar57[1] = auVar57[0];
                auVar57._8_8_ = 0;
                auVar57 = pshuflw(auVar57,auVar57,0);
                cVar43 = auVar57[0];
                cVar49 = auVar57[1];
                cVar51 = auVar57[2];
                cVar53 = auVar57[3];
                cVar21 = -((char)size * auVar58[0]);
                auVar58 = ZEXT216(CONCAT11(cVar21,cVar21));
                auVar58 = pshuflw(auVar58,auVar58,0);
                uVar30 = auVar58._0_4_;
                auVar68._0_8_ = CONCAT44(uVar30,uVar30);
                auVar68._8_4_ = uVar30;
                auVar68._12_4_ = uVar30;
                auVar70._0_8_ = auVar68._0_8_ << 8;
                auVar70._8_8_ = auVar68._8_8_ << 8 | (ulong)(uVar30 >> 0x18);
                auVar58 = paddsb(auVar70,ZEXT116(bVar22));
                lVar31 = (long)iVar34;
                uVar37 = 0;
                do {
                  lVar39 = 0;
                  lVar38 = lVar31;
                  do {
                    lVar41 = lVar38;
                    if (s1_beg != 0) {
                      lVar41 = 0;
                    }
                    uVar48 = 0x80;
                    if (-0x80 < lVar41) {
                      uVar48 = (undefined1)lVar41;
                    }
                    *(undefined1 *)((long)&local_48 + lVar39) = uVar48;
                    lVar41 = lVar41 - (ulong)(uint)open;
                    if (lVar41 < -0x7f) {
                      lVar41 = -0x80;
                    }
                    *(char *)((long)&local_58 + lVar39) = (char)lVar41;
                    lVar39 = lVar39 + 1;
                    lVar38 = lVar38 - size * (uint)gap;
                  } while (lVar39 != 0x10);
                  ptr_02[uVar37][0] = local_48;
                  ptr_02[uVar37][1] = lStack_40;
                  ptr[uVar37][0] = local_58;
                  ptr[uVar37][1] = lStack_50;
                  uVar37 = uVar37 + 1;
                  lVar31 = lVar31 - (ulong)(uint)gap;
                } while (uVar37 != size);
                *ptr_00 = '\0';
                uVar37 = 1;
                if (1 < s2Len) {
                  uVar37 = uVar33;
                }
                uVar32 = 0;
                do {
                  iVar35 = -0x80;
                  if (-0x80 < iVar34) {
                    iVar35 = (int8_t)iVar34;
                  }
                  if (s2_beg != 0) {
                    iVar35 = '\0';
                  }
                  ptr_00[uVar32 + 1] = iVar35;
                  iVar34 = iVar34 - gap;
                  uVar32 = uVar32 + 1;
                } while (uVar37 != uVar32);
                alVar66 = (__m128i)psubsb((undefined1  [16])0x0,auVar61);
                palVar29 = ptr_03 + (uVar42 - 1);
                uVar37 = size;
                do {
                  *palVar29 = alVar66;
                  auVar57 = _DAT_008d0a10;
                  auVar79._4_4_ = uVar44;
                  auVar79._0_4_ = uVar44;
                  auVar79._8_4_ = uVar44;
                  auVar79._12_4_ = uVar44;
                  alVar66 = (__m128i)psubsb((undefined1  [16])alVar66,auVar79);
                  auVar73[0] = -((char)alVar66[0] < auVar59[0]);
                  auVar73[1] = -(alVar66[0]._1_1_ < auVar59[1]);
                  auVar73[2] = -(alVar66[0]._2_1_ < auVar59[2]);
                  auVar73[3] = -(alVar66[0]._3_1_ < auVar59[3]);
                  auVar73[4] = -(alVar66[0]._4_1_ < auVar59[4]);
                  auVar73[5] = -(alVar66[0]._5_1_ < auVar59[5]);
                  auVar73[6] = -(alVar66[0]._6_1_ < auVar59[6]);
                  auVar73[7] = -(alVar66[0]._7_1_ < auVar59[7]);
                  auVar73[8] = -((char)alVar66[1] < auVar59[8]);
                  auVar73[9] = -(alVar66[1]._1_1_ < auVar59[9]);
                  auVar73[10] = -(alVar66[1]._2_1_ < auVar59[10]);
                  auVar73[0xb] = -(alVar66[1]._3_1_ < auVar59[0xb]);
                  auVar73[0xc] = -(alVar66[1]._4_1_ < auVar59[0xc]);
                  auVar73[0xd] = -(alVar66[1]._5_1_ < auVar59[0xd]);
                  auVar73[0xe] = -(alVar66[1]._6_1_ < auVar59[0xe]);
                  auVar73[0xf] = -(alVar66[1]._7_1_ < auVar59[0xf]);
                  auVar59 = ~auVar73 & auVar59 | (undefined1  [16])alVar66 & auVar73;
                  palVar29 = palVar29 + -1;
                  iVar34 = (int)uVar37;
                  uVar30 = iVar34 - 1;
                  uVar37 = (ulong)uVar30;
                } while (uVar30 != 0 && 0 < iVar34);
                uVar37 = 1;
                if (1 < s2Len) {
                  uVar37 = uVar33;
                }
                lVar31 = (ulong)(uVar42 + (uVar42 == 0)) << 4;
                lVar38 = size * uVar33;
                local_160 = 0;
                uVar32 = 0;
                auVar68 = auVar46;
                auVar70 = auVar46;
                iVar34 = iVar25;
                do {
                  iVar28 = ppVar18->mapper[(byte)s2[uVar32]];
                  auVar72 = psubsb(auVar46,(undefined1  [16])*ptr_03);
                  uVar1 = ptr_02[uVar42 - 1][0];
                  auVar78._0_8_ = uVar1 << 8;
                  auVar78._8_8_ = ptr_02[uVar42 - 1][1] << 8 | uVar1 >> 0x38;
                  lVar39 = 0;
                  auVar79 = auVar46;
                  auVar73 = ~auVar57 & ZEXT116((byte)ptr_00[uVar32]) | auVar78;
                  do {
                    auVar78 = *(undefined1 (*) [16])((long)*ptr_02 + lVar39);
                    auVar63._4_4_ = uVar44;
                    auVar63._0_4_ = uVar44;
                    auVar63._8_4_ = uVar44;
                    auVar63._12_4_ = uVar44;
                    auVar63 = psubsb(*(undefined1 (*) [16])((long)*ptr + lVar39),auVar63);
                    auVar83 = psubsb(auVar78,auVar61);
                    auVar84[0] = -(auVar83[0] < auVar63[0]);
                    auVar84[1] = -(auVar83[1] < auVar63[1]);
                    auVar84[2] = -(auVar83[2] < auVar63[2]);
                    auVar84[3] = -(auVar83[3] < auVar63[3]);
                    auVar84[4] = -(auVar83[4] < auVar63[4]);
                    auVar84[5] = -(auVar83[5] < auVar63[5]);
                    auVar84[6] = -(auVar83[6] < auVar63[6]);
                    auVar84[7] = -(auVar83[7] < auVar63[7]);
                    auVar84[8] = -(auVar83[8] < auVar63[8]);
                    auVar84[9] = -(auVar83[9] < auVar63[9]);
                    auVar84[10] = -(auVar83[10] < auVar63[10]);
                    auVar84[0xb] = -(auVar83[0xb] < auVar63[0xb]);
                    auVar84[0xc] = -(auVar83[0xc] < auVar63[0xc]);
                    auVar84[0xd] = -(auVar83[0xd] < auVar63[0xd]);
                    auVar84[0xe] = -(auVar83[0xe] < auVar63[0xe]);
                    auVar84[0xf] = -(auVar83[0xf] < auVar63[0xf]);
                    auVar84 = ~auVar84 & auVar83 | auVar63 & auVar84;
                    auVar63 = paddsb(auVar73,*(undefined1 (*) [16])
                                              ((long)pvVar17 + lVar39 + size * (long)iVar28 * 0x10))
                    ;
                    auVar73 = paddsb(auVar72,*(undefined1 (*) [16])((long)*ptr_03 + lVar39));
                    auVar83[0] = -(auVar73[0] < auVar79[0]);
                    auVar83[1] = -(auVar73[1] < auVar79[1]);
                    auVar83[2] = -(auVar73[2] < auVar79[2]);
                    auVar83[3] = -(auVar73[3] < auVar79[3]);
                    auVar83[4] = -(auVar73[4] < auVar79[4]);
                    auVar83[5] = -(auVar73[5] < auVar79[5]);
                    auVar83[6] = -(auVar73[6] < auVar79[6]);
                    auVar83[7] = -(auVar73[7] < auVar79[7]);
                    auVar83[8] = -(auVar73[8] < auVar79[8]);
                    auVar83[9] = -(auVar73[9] < auVar79[9]);
                    auVar83[10] = -(auVar73[10] < auVar79[10]);
                    auVar83[0xb] = -(auVar73[0xb] < auVar79[0xb]);
                    auVar83[0xc] = -(auVar73[0xc] < auVar79[0xc]);
                    auVar83[0xd] = -(auVar73[0xd] < auVar79[0xd]);
                    auVar83[0xe] = -(auVar73[0xe] < auVar79[0xe]);
                    auVar83[0xf] = -(auVar73[0xf] < auVar79[0xf]);
                    auVar79 = ~auVar83 & auVar73 | auVar79 & auVar83;
                    auVar72[0] = -(auVar63[0] < auVar84[0]);
                    auVar72[1] = -(auVar63[1] < auVar84[1]);
                    auVar72[2] = -(auVar63[2] < auVar84[2]);
                    auVar72[3] = -(auVar63[3] < auVar84[3]);
                    auVar72[4] = -(auVar63[4] < auVar84[4]);
                    auVar72[5] = -(auVar63[5] < auVar84[5]);
                    auVar72[6] = -(auVar63[6] < auVar84[6]);
                    auVar72[7] = -(auVar63[7] < auVar84[7]);
                    auVar72[8] = -(auVar63[8] < auVar84[8]);
                    auVar72[9] = -(auVar63[9] < auVar84[9]);
                    auVar72[10] = -(auVar63[10] < auVar84[10]);
                    auVar72[0xb] = -(auVar63[0xb] < auVar84[0xb]);
                    auVar72[0xc] = -(auVar63[0xc] < auVar84[0xc]);
                    auVar72[0xd] = -(auVar63[0xd] < auVar84[0xd]);
                    auVar72[0xe] = -(auVar63[0xe] < auVar84[0xe]);
                    auVar72[0xf] = -(auVar63[0xf] < auVar84[0xf]);
                    *(undefined1 (*) [16])((long)*ptr + lVar39) = auVar84;
                    auVar72 = ~auVar72 & auVar63 | auVar84 & auVar72;
                    *(undefined1 (*) [16])((long)*ptr_01 + lVar39) = auVar72;
                    lVar39 = lVar39 + 0x10;
                    auVar73 = auVar78;
                  } while (lVar31 != lVar39);
                  auVar82._0_8_ = auVar72._0_8_ << 8;
                  auVar82._8_8_ = auVar72._8_8_ << 8 | auVar72._0_8_ >> 0x38;
                  uVar1 = uVar32 + 1;
                  auVar82 = ~auVar57 & ZEXT116((byte)ptr_00[uVar32 + 1]) | auVar82;
                  auVar73 = paddsb((undefined1  [16])*ptr_03,auVar82);
                  auVar74[0] = -(auVar73[0] < auVar79[0]);
                  auVar74[1] = -(auVar73[1] < auVar79[1]);
                  auVar74[2] = -(auVar73[2] < auVar79[2]);
                  auVar74[3] = -(auVar73[3] < auVar79[3]);
                  auVar74[4] = -(auVar73[4] < auVar79[4]);
                  auVar74[5] = -(auVar73[5] < auVar79[5]);
                  auVar74[6] = -(auVar73[6] < auVar79[6]);
                  auVar74[7] = -(auVar73[7] < auVar79[7]);
                  auVar74[8] = -(auVar73[8] < auVar79[8]);
                  auVar74[9] = -(auVar73[9] < auVar79[9]);
                  auVar74[10] = -(auVar73[10] < auVar79[10]);
                  auVar74[0xb] = -(auVar73[0xb] < auVar79[0xb]);
                  auVar74[0xc] = -(auVar73[0xc] < auVar79[0xc]);
                  auVar74[0xd] = -(auVar73[0xd] < auVar79[0xd]);
                  auVar74[0xe] = -(auVar73[0xe] < auVar79[0xe]);
                  auVar74[0xf] = -(auVar73[0xf] < auVar79[0xf]);
                  auVar79 = ~auVar74 & auVar73 | auVar79 & auVar74;
                  iVar28 = 0xe;
                  do {
                    auVar75._0_8_ = auVar79._0_8_ << 8;
                    auVar75._8_8_ = auVar79._8_8_ << 8 | auVar79._0_8_ >> 0x38;
                    auVar73 = paddsb(auVar75,auVar58);
                    auVar55[0] = -(auVar73[0] < auVar79[0]);
                    auVar55[1] = -(auVar73[1] < auVar79[1]);
                    auVar55[2] = -(auVar73[2] < auVar79[2]);
                    auVar55[3] = -(auVar73[3] < auVar79[3]);
                    auVar55[4] = -(auVar73[4] < auVar79[4]);
                    auVar55[5] = -(auVar73[5] < auVar79[5]);
                    auVar55[6] = -(auVar73[6] < auVar79[6]);
                    auVar55[7] = -(auVar73[7] < auVar79[7]);
                    auVar55[8] = -(auVar73[8] < auVar79[8]);
                    auVar55[9] = -(auVar73[9] < auVar79[9]);
                    auVar55[10] = -(auVar73[10] < auVar79[10]);
                    auVar55[0xb] = -(auVar73[0xb] < auVar79[0xb]);
                    auVar55[0xc] = -(auVar73[0xc] < auVar79[0xc]);
                    auVar55[0xd] = -(auVar73[0xd] < auVar79[0xd]);
                    auVar55[0xe] = -(auVar73[0xe] < auVar79[0xe]);
                    auVar55[0xf] = -(auVar73[0xf] < auVar79[0xf]);
                    auVar79 = ~auVar55 & auVar73 | auVar79 & auVar55;
                    iVar28 = iVar28 + -1;
                  } while (iVar28 != 0);
                  auVar76._0_8_ = auVar79._0_8_ << 8;
                  auVar76._8_8_ = auVar79._8_8_ << 8 | auVar79._0_8_ >> 0x38;
                  auVar79 = paddsb(auVar76,ZEXT116(bVar22));
                  auVar80[0] = -(auVar79[0] < auVar82[0]);
                  auVar80[1] = -(auVar79[1] < auVar82[1]);
                  auVar80[2] = -(auVar79[2] < auVar82[2]);
                  auVar80[3] = -(auVar79[3] < auVar82[3]);
                  auVar80[4] = -(auVar79[4] < auVar82[4]);
                  auVar80[5] = -(auVar79[5] < auVar82[5]);
                  auVar80[6] = -(auVar79[6] < auVar82[6]);
                  auVar80[7] = -(auVar79[7] < auVar82[7]);
                  auVar80[8] = -(auVar79[8] < auVar82[8]);
                  auVar80[9] = -(auVar79[9] < auVar82[9]);
                  auVar80[10] = -(auVar79[10] < auVar82[10]);
                  auVar80[0xb] = -(auVar79[0xb] < auVar82[0xb]);
                  auVar80[0xc] = -(auVar79[0xc] < auVar82[0xc]);
                  auVar80[0xd] = -(auVar79[0xd] < auVar82[0xd]);
                  auVar80[0xe] = -(auVar79[0xe] < auVar82[0xe]);
                  auVar80[0xf] = -(auVar79[0xf] < auVar82[0xf]);
                  auVar73 = ~auVar80 & auVar79 | auVar82 & auVar80;
                  lVar41 = 0;
                  lVar39 = local_160;
                  do {
                    auVar72 = *(undefined1 (*) [16])((long)*ptr_01 + lVar41);
                    auVar20._4_4_ = uVar44;
                    auVar20._0_4_ = uVar44;
                    auVar20._8_4_ = uVar44;
                    auVar20._12_4_ = uVar44;
                    auVar79 = psubsb(auVar79,auVar20);
                    auVar73 = psubsb(auVar73,auVar61);
                    auVar64[0] = -(auVar73[0] < auVar79[0]);
                    auVar64[1] = -(auVar73[1] < auVar79[1]);
                    auVar64[2] = -(auVar73[2] < auVar79[2]);
                    auVar64[3] = -(auVar73[3] < auVar79[3]);
                    auVar64[4] = -(auVar73[4] < auVar79[4]);
                    auVar64[5] = -(auVar73[5] < auVar79[5]);
                    auVar64[6] = -(auVar73[6] < auVar79[6]);
                    auVar64[7] = -(auVar73[7] < auVar79[7]);
                    auVar64[8] = -(auVar73[8] < auVar79[8]);
                    auVar64[9] = -(auVar73[9] < auVar79[9]);
                    auVar64[10] = -(auVar73[10] < auVar79[10]);
                    auVar64[0xb] = -(auVar73[0xb] < auVar79[0xb]);
                    auVar64[0xc] = -(auVar73[0xc] < auVar79[0xc]);
                    auVar64[0xd] = -(auVar73[0xd] < auVar79[0xd]);
                    auVar64[0xe] = -(auVar73[0xe] < auVar79[0xe]);
                    auVar64[0xf] = -(auVar73[0xf] < auVar79[0xf]);
                    auVar79 = auVar79 & auVar64 | ~auVar64 & auVar73;
                    auVar81[0] = -(auVar79[0] < auVar72[0]);
                    auVar81[1] = -(auVar79[1] < auVar72[1]);
                    auVar81[2] = -(auVar79[2] < auVar72[2]);
                    auVar81[3] = -(auVar79[3] < auVar72[3]);
                    auVar81[4] = -(auVar79[4] < auVar72[4]);
                    auVar81[5] = -(auVar79[5] < auVar72[5]);
                    auVar81[6] = -(auVar79[6] < auVar72[6]);
                    auVar81[7] = -(auVar79[7] < auVar72[7]);
                    auVar81[8] = -(auVar79[8] < auVar72[8]);
                    auVar81[9] = -(auVar79[9] < auVar72[9]);
                    auVar81[10] = -(auVar79[10] < auVar72[10]);
                    auVar81[0xb] = -(auVar79[0xb] < auVar72[0xb]);
                    auVar81[0xc] = -(auVar79[0xc] < auVar72[0xc]);
                    auVar81[0xd] = -(auVar79[0xd] < auVar72[0xd]);
                    auVar81[0xe] = -(auVar79[0xe] < auVar72[0xe]);
                    auVar81[0xf] = -(auVar79[0xf] < auVar72[0xf]);
                    auVar73 = ~auVar81 & auVar79 | auVar72 & auVar81;
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar41) = auVar73;
                    piVar19 = ((ppVar26->field_4).rowcols)->score_row;
                    cVar21 = *(char *)((long)*ptr_02 + lVar41 + 1);
                    cVar2 = *(char *)((long)*ptr_02 + lVar41 + 2);
                    cVar3 = *(char *)((long)*ptr_02 + lVar41 + 3);
                    cVar4 = *(char *)((long)*ptr_02 + lVar41 + 4);
                    cVar5 = *(char *)((long)*ptr_02 + lVar41 + 5);
                    cVar6 = *(char *)((long)*ptr_02 + lVar41 + 6);
                    cVar7 = *(char *)((long)*ptr_02 + lVar41 + 7);
                    cVar8 = *(char *)((long)*ptr_02 + lVar41 + 8);
                    cVar9 = *(char *)((long)*ptr_02 + lVar41 + 9);
                    cVar10 = *(char *)((long)*ptr_02 + lVar41 + 10);
                    cVar11 = *(char *)((long)*ptr_02 + lVar41 + 0xb);
                    cVar12 = *(char *)((long)*ptr_02 + lVar41 + 0xc);
                    cVar13 = *(char *)((long)*ptr_02 + lVar41 + 0xd);
                    cVar14 = *(char *)((long)*ptr_02 + lVar41 + 0xe);
                    cVar15 = *(char *)((long)*ptr_02 + lVar41 + 0xf);
                    *(int *)((long)piVar19 + lVar39) = (int)*(char *)((long)*ptr_02 + lVar41);
                    *(int *)((long)piVar19 + lVar38 * 4 + lVar39) = (int)cVar21;
                    *(int *)((long)piVar19 + lVar38 * 8 + lVar39) = (int)cVar2;
                    *(int *)((long)piVar19 + lVar38 * 0xc + lVar39) = (int)cVar3;
                    *(int *)((long)piVar19 + lVar38 * 0x10 + lVar39) = (int)cVar4;
                    *(int *)((long)piVar19 + lVar38 * 0x14 + lVar39) = (int)cVar5;
                    *(int *)((long)piVar19 + lVar38 * 0x18 + lVar39) = (int)cVar6;
                    *(int *)((long)piVar19 + lVar38 * 0x1c + lVar39) = (int)cVar7;
                    *(int *)((long)piVar19 + lVar38 * 0x20 + lVar39) = (int)cVar8;
                    *(int *)((long)piVar19 + lVar38 * 0x24 + lVar39) = (int)cVar9;
                    *(int *)((long)piVar19 + lVar38 * 0x28 + lVar39) = (int)cVar10;
                    *(int *)((long)piVar19 + lVar38 * 0x2c + lVar39) = (int)cVar11;
                    *(int *)((long)piVar19 + lVar38 * 0x30 + lVar39) = (int)cVar12;
                    *(int *)((long)piVar19 + lVar38 * 0x34 + lVar39) = (int)cVar13;
                    *(int *)((long)piVar19 + lVar38 * 0x38 + lVar39) = (int)cVar14;
                    *(int *)((long)piVar19 + lVar38 * 0x3c + lVar39) = (int)cVar15;
                    auVar56[0] = -(auVar73[0] < auVar59[0]);
                    auVar56[1] = -(auVar73[1] < auVar59[1]);
                    auVar56[2] = -(auVar73[2] < auVar59[2]);
                    auVar56[3] = -(auVar73[3] < auVar59[3]);
                    auVar56[4] = -(auVar73[4] < auVar59[4]);
                    auVar56[5] = -(auVar73[5] < auVar59[5]);
                    auVar56[6] = -(auVar73[6] < auVar59[6]);
                    auVar56[7] = -(auVar73[7] < auVar59[7]);
                    auVar56[8] = -(auVar73[8] < auVar59[8]);
                    auVar56[9] = -(auVar73[9] < auVar59[9]);
                    auVar56[10] = -(auVar73[10] < auVar59[10]);
                    auVar56[0xb] = -(auVar73[0xb] < auVar59[0xb]);
                    auVar56[0xc] = -(auVar73[0xc] < auVar59[0xc]);
                    auVar56[0xd] = -(auVar73[0xd] < auVar59[0xd]);
                    auVar56[0xe] = -(auVar73[0xe] < auVar59[0xe]);
                    auVar56[0xf] = -(auVar73[0xf] < auVar59[0xf]);
                    auVar59 = ~auVar56 & auVar59 | auVar73 & auVar56;
                    auVar60[0] = -(auVar79[0] < auVar59[0]);
                    auVar60[1] = -(auVar79[1] < auVar59[1]);
                    auVar60[2] = -(auVar79[2] < auVar59[2]);
                    auVar60[3] = -(auVar79[3] < auVar59[3]);
                    auVar60[4] = -(auVar79[4] < auVar59[4]);
                    auVar60[5] = -(auVar79[5] < auVar59[5]);
                    auVar60[6] = -(auVar79[6] < auVar59[6]);
                    auVar60[7] = -(auVar79[7] < auVar59[7]);
                    auVar60[8] = -(auVar79[8] < auVar59[8]);
                    auVar60[9] = -(auVar79[9] < auVar59[9]);
                    auVar60[10] = -(auVar79[10] < auVar59[10]);
                    auVar60[0xb] = -(auVar79[0xb] < auVar59[0xb]);
                    auVar60[0xc] = -(auVar79[0xc] < auVar59[0xc]);
                    auVar60[0xd] = -(auVar79[0xd] < auVar59[0xd]);
                    auVar60[0xe] = -(auVar79[0xe] < auVar59[0xe]);
                    auVar60[0xf] = -(auVar79[0xf] < auVar59[0xf]);
                    auVar59 = ~auVar60 & auVar59 | auVar79 & auVar60;
                    auVar67[0] = -(auVar73[0] < auVar68[0]);
                    auVar67[1] = -(auVar73[1] < auVar68[1]);
                    auVar67[2] = -(auVar73[2] < auVar68[2]);
                    auVar67[3] = -(auVar73[3] < auVar68[3]);
                    auVar67[4] = -(auVar73[4] < auVar68[4]);
                    auVar67[5] = -(auVar73[5] < auVar68[5]);
                    auVar67[6] = -(auVar73[6] < auVar68[6]);
                    auVar67[7] = -(auVar73[7] < auVar68[7]);
                    auVar67[8] = -(auVar73[8] < auVar68[8]);
                    auVar67[9] = -(auVar73[9] < auVar68[9]);
                    auVar67[10] = -(auVar73[10] < auVar68[10]);
                    auVar67[0xb] = -(auVar73[0xb] < auVar68[0xb]);
                    auVar67[0xc] = -(auVar73[0xc] < auVar68[0xc]);
                    auVar67[0xd] = -(auVar73[0xd] < auVar68[0xd]);
                    auVar67[0xe] = -(auVar73[0xe] < auVar68[0xe]);
                    auVar67[0xf] = -(auVar73[0xf] < auVar68[0xf]);
                    auVar68 = ~auVar67 & auVar73 | auVar68 & auVar67;
                    lVar41 = lVar41 + 0x10;
                    lVar39 = lVar39 + uVar33 * 4;
                  } while (lVar31 != lVar41);
                  alVar66 = ptr_02[(uint)(iVar23 % (int)uVar42)];
                  auVar65[0] = -(auVar70[0] < (char)alVar66[0]);
                  auVar65[1] = -(auVar70[1] < alVar66[0]._1_1_);
                  auVar65[2] = -(auVar70[2] < alVar66[0]._2_1_);
                  auVar65[3] = -(auVar70[3] < alVar66[0]._3_1_);
                  auVar65[4] = -(auVar70[4] < alVar66[0]._4_1_);
                  auVar65[5] = -(auVar70[5] < alVar66[0]._5_1_);
                  auVar65[6] = -(auVar70[6] < alVar66[0]._6_1_);
                  auVar65[7] = -(auVar70[7] < alVar66[0]._7_1_);
                  auVar65[8] = -(auVar70[8] < (char)alVar66[1]);
                  auVar65[9] = -(auVar70[9] < alVar66[1]._1_1_);
                  auVar65[10] = -(auVar70[10] < alVar66[1]._2_1_);
                  auVar65[0xb] = -(auVar70[0xb] < alVar66[1]._3_1_);
                  auVar65[0xc] = -(auVar70[0xc] < alVar66[1]._4_1_);
                  auVar65[0xd] = -(auVar70[0xd] < alVar66[1]._5_1_);
                  auVar65[0xe] = -(auVar70[0xe] < alVar66[1]._6_1_);
                  auVar65[0xf] = -(auVar70[0xf] < alVar66[1]._7_1_);
                  auVar77[1] = -(cVar49 == '\x0e');
                  auVar77[0] = -(cVar43 == '\x0f');
                  auVar77[2] = -(cVar51 == '\r');
                  auVar77[3] = -(cVar53 == '\f');
                  auVar77[4] = -(cVar43 == '\v');
                  auVar77[5] = -(cVar49 == '\n');
                  auVar77[6] = -(cVar51 == '\t');
                  auVar77[7] = -(cVar53 == '\b');
                  auVar77[8] = -(cVar43 == '\a');
                  auVar77[9] = -(cVar49 == '\x06');
                  auVar77[10] = -(cVar51 == '\x05');
                  auVar77[0xb] = -(cVar53 == '\x04');
                  auVar77[0xc] = -(cVar43 == '\x03');
                  auVar77[0xd] = -(cVar49 == '\x02');
                  auVar77[0xe] = -(cVar51 == '\x01');
                  auVar77[0xf] = -(cVar53 == '\0');
                  auVar77 = auVar65 & auVar77;
                  local_158 = (int)uVar32;
                  if ((((((((((((((((auVar77 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar77 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar77 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar77 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar77 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar77 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar77 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar77 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar77 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar77 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar77 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar77 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar77 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar77 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar77 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar77[0xf] < '\0') {
                    iVar34 = local_158;
                  }
                  auVar70 = ~auVar65 & auVar70 | (undefined1  [16])alVar66 & auVar65;
                  uVar71 = auVar70._14_2_;
                  local_160 = local_160 + 4;
                  uVar32 = uVar1;
                } while (uVar1 != uVar37);
                local_78 = auVar54[0];
                cStack_77 = auVar54[1];
                cStack_76 = auVar54[2];
                cStack_75 = auVar54[3];
                if (s2_end != 0) {
                  if (iVar24 < 0xf) {
                    iVar28 = 1;
                    if (1 < iVar27) {
                      iVar28 = iVar27;
                    }
                    do {
                      auVar54._0_8_ = auVar70._0_8_ << 8;
                      auVar54._8_8_ = auVar70._8_8_ << 8 | auVar70._0_8_ >> 0x38;
                      uVar71 = auVar70._13_2_;
                      iVar28 = iVar28 + -1;
                      auVar70 = auVar54;
                    } while (iVar28 != 0);
                  }
                  uVar40 = uVar71 >> 8;
                }
                cVar21 = (char)uVar40;
                iVar28 = iVar23;
                if ((s1_end != 0) && ((uVar62 & 0x7ffffff0) != 0)) {
                  uVar33 = 0;
                  do {
                    iVar36 = ((uint)uVar33 & 0xf) * uVar42 + ((uint)(uVar33 >> 4) & 0xfffffff);
                    if (iVar36 < (int)uVar16) {
                      bVar22 = *(byte *)((long)*ptr_02 + uVar33);
                      if ((char)(byte)uVar40 < (char)bVar22) {
                        uVar40 = (ushort)bVar22;
                        iVar34 = iVar25;
                        iVar28 = iVar36;
                      }
                      else {
                        if (iVar28 <= iVar36) {
                          iVar36 = iVar28;
                        }
                        if (iVar34 != iVar25) {
                          iVar36 = iVar28;
                        }
                        if (bVar22 == (byte)uVar40) {
                          iVar28 = iVar36;
                        }
                      }
                    }
                    cVar21 = (char)uVar40;
                    uVar33 = uVar33 + 1;
                  } while ((uVar42 & 0x7ffffff) << 4 != (int)uVar33);
                }
                if (s2_end == 0 && s1_end == 0) {
                  uVar33 = ptr_02[(uint)(iVar23 % (int)uVar42)][0];
                  uVar62 = ptr_02[(uint)(iVar23 % (int)uVar42)][1];
                  if (iVar24 < 0xf) {
                    iVar24 = 1;
                    if (1 < iVar27) {
                      iVar24 = iVar27;
                    }
                    do {
                      uVar62 = uVar62 << 8 | uVar33 >> 0x38;
                      iVar24 = iVar24 + -1;
                      uVar33 = uVar33 << 8;
                    } while (iVar24 != 0);
                  }
                  cVar21 = (char)(uVar62 >> 0x38);
                  iVar34 = iVar25;
                  iVar28 = iVar23;
                }
                cVar43 = auVar45[0];
                auVar47[0] = -(auVar59[0] < cVar43);
                cVar49 = auVar45[1];
                auVar47[1] = -(auVar59[1] < cVar49);
                cVar51 = auVar45[2];
                auVar47[2] = -(auVar59[2] < cVar51);
                cVar53 = auVar45[3];
                auVar47[3] = -(auVar59[3] < cVar53);
                auVar47[4] = -(auVar59[4] < cVar43);
                auVar47[5] = -(auVar59[5] < cVar49);
                auVar47[6] = -(auVar59[6] < cVar51);
                auVar47[7] = -(auVar59[7] < cVar53);
                auVar47[8] = -(auVar59[8] < cVar43);
                auVar47[9] = -(auVar59[9] < cVar49);
                auVar47[10] = -(auVar59[10] < cVar51);
                auVar47[0xb] = -(auVar59[0xb] < cVar53);
                auVar47[0xc] = -(auVar59[0xc] < cVar43);
                auVar47[0xd] = -(auVar59[0xd] < cVar49);
                auVar47[0xe] = -(auVar59[0xe] < cVar51);
                auVar47[0xf] = -(auVar59[0xf] < cVar53);
                auVar69[0] = -(local_78 < auVar68[0]);
                auVar69[1] = -(cStack_77 < auVar68[1]);
                auVar69[2] = -(cStack_76 < auVar68[2]);
                auVar69[3] = -(cStack_75 < auVar68[3]);
                auVar69[4] = -(local_78 < auVar68[4]);
                auVar69[5] = -(cStack_77 < auVar68[5]);
                auVar69[6] = -(cStack_76 < auVar68[6]);
                auVar69[7] = -(cStack_75 < auVar68[7]);
                auVar69[8] = -(local_78 < auVar68[8]);
                auVar69[9] = -(cStack_77 < auVar68[9]);
                auVar69[10] = -(cStack_76 < auVar68[10]);
                auVar69[0xb] = -(cStack_75 < auVar68[0xb]);
                auVar69[0xc] = -(local_78 < auVar68[0xc]);
                auVar69[0xd] = -(cStack_77 < auVar68[0xd]);
                auVar69[0xe] = -(cStack_76 < auVar68[0xe]);
                auVar69[0xf] = -(cStack_75 < auVar68[0xf]);
                auVar69 = auVar69 | auVar47;
                if ((((((((((((((((auVar69 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar69 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar69 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar69 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar69 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar69 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar69 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar69 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar69 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar69 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar69 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar69 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar69[0xf] < '\0') {
                  *(byte *)&ppVar26->flag = (byte)ppVar26->flag | 0x40;
                  cVar21 = '\0';
                  iVar34 = 0;
                  iVar28 = 0;
                }
                ppVar26->score = (int)cVar21;
                ppVar26->end_query = iVar28;
                ppVar26->end_ref = iVar34;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar26;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m128i vZero;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi8(_mm_set1_epi8(position),
            _mm_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi8_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi8(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi8(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi8(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 1);
        vHp = _mm_insert_epi8_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi8_rpl(
                    _mm_subs_epi8(vE, vGapE),
                    _mm_subs_epi8(vH, vGapO));
            vHp = _mm_adds_epi8(vHp, vW);
            vF = _mm_max_epi8_rpl(vF, _mm_adds_epi8(vHt, pvGapper[i]));
            vHt = _mm_max_epi8_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 1);
        vHt = _mm_insert_epi8_rpl(vHt, boundary[j+1], 0);
        vF = _mm_max_epi8_rpl(vF, _mm_adds_epi8(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 1);
            vFt = _mm_adds_epi8(vFt, vSegLenXgap);
            vF = _mm_max_epi8_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 1);
        vF = _mm_adds_epi8(vF, vNegInfFront);
        vH = _mm_max_epi8_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi8_rpl(
                    _mm_subs_epi8(vF, vGapE),
                    _mm_subs_epi8(vH, vGapO));
            vH = _mm_max_epi8_rpl(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi8(vH, vMaxH));
            vMaxH = _mm_max_epi8_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8_rpl (vH, 15);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 1);
        }
        score = (int8_t) _mm_extract_epi8_rpl(vMaxH, 15);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            score = (int8_t) _mm_extract_epi8_rpl (vH, 15);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}